

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

size_t readfromfile(Form *form,char *buffer,size_t size)

{
  FormData *pFVar1;
  size_t sVar2;
  FILE *__stream;
  
  pFVar1 = form->data;
  if (pFVar1->type == FORM_CALLBACK) {
    if (form->fread_func == (curl_read_callback)0x0) {
      return 0;
    }
    sVar2 = (*form->fread_func)(buffer,1,size,pFVar1->line);
  }
  else {
    __stream = (FILE *)form->fp;
    if (__stream == (FILE *)0x0) {
      __stream = fopen64(pFVar1->line,"rb");
      form->fp = (FILE *)__stream;
      if (__stream == (FILE *)0x0) {
        return 0xffffffffffffffff;
      }
    }
    sVar2 = fread(buffer,1,size,__stream);
  }
  if (sVar2 == 0) {
    if ((FILE *)form->fp != (FILE *)0x0) {
      fclose((FILE *)form->fp);
      form->fp = (FILE *)0x0;
    }
    form->data = form->data->next;
    return 0;
  }
  return sVar2;
}

Assistant:

static size_t readfromfile(struct Form *form, char *buffer,
                           size_t size)
{
  size_t nread;
  bool callback = (form->data->type == FORM_CALLBACK)?TRUE:FALSE;

  if(callback) {
    if(form->fread_func == ZERO_NULL)
      return 0;
    else
      nread = form->fread_func(buffer, 1, size, form->data->line);
  }
  else {
    if(!form->fp) {
      /* this file hasn't yet been opened */
      form->fp = fopen_read(form->data->line, "rb"); /* b is for binary */
      if(!form->fp)
        return (size_t)-1; /* failure */
    }
    nread = fread(buffer, 1, size, form->fp);
  }
  if(!nread) {
    /* this is the last chunk from the file, move on */
    if(form->fp) {
      fclose(form->fp);
      form->fp = NULL;
    }
    form->data = form->data->next;
  }

  return nread;
}